

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_comparable.c
# Opt level: O0

int comparable_callback_int(comparable a,comparable b)

{
  int int_var_b;
  int int_var_a;
  int *int_ptr_b;
  int *int_ptr_a;
  comparable b_local;
  comparable a_local;
  undefined4 local_4;
  
  if (*a < *b) {
    local_4 = -1;
  }
  else if (*b < *a) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int comparable_callback_int(const comparable a, const comparable b)
{
	const int *int_ptr_a = a;
	const int *int_ptr_b = b;

	const int int_var_a = *int_ptr_a;
	const int int_var_b = *int_ptr_b;

	if (int_var_a < int_var_b)
	{
		return -1;
	}
	else if (int_var_a > int_var_b)
	{
		return 1;
	}
	else
	{
		return 0;
	}
}